

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

VarStatus __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::basisColStatus(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,int col)

{
  type_conflict5 tVar1;
  VarStatus VVar2;
  Real local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_98;
  
  VVar2 = ZERO;
  if ((-1 < col) &&
     (col < (this->_realLP->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thenum)) {
    if (this->_hasBasis == false) {
      lowerReal(&local_98,this,col);
      local_a0 = -this->_currentSettings->_realParamValues[6];
      tVar1 = boost::multiprecision::operator>(&local_98,&local_a0);
      if (tVar1) {
        VVar2 = ON_LOWER;
      }
      else {
        upperReal(&local_98,this,col);
        local_a0 = this->_currentSettings->_realParamValues[6];
        tVar1 = boost::multiprecision::operator<(&local_98,&local_a0);
        VVar2 = (uint)!tVar1 + (uint)!tVar1 * 2;
      }
    }
    else {
      if (this->_isRealLPLoaded == true) {
        VVar2 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getBasisColStatus(&this->_solver,col);
        return VVar2;
      }
      VVar2 = (this->_basisStatusCols).data[(uint)col];
    }
  }
  return VVar2;
}

Assistant:

typename SPxSolverBase<R>::VarStatus SoPlexBase<R>::basisColStatus(int col) const
{
   assert(col >= 0);
   assert(col < numCols());

   // if index is out of range, return nonbasic status as for a newly added unbounded column
   if(col < 0 || col >= numCols())
   {
      return SPxSolverBase<R>::ZERO;
   }
   // if no basis is available, return slack basis
   else if(!hasBasis())
   {
      if(lowerReal(col) > -realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_LOWER;
      else if(upperReal(col) < realParam(SoPlexBase<R>::INFTY))
         return SPxSolverBase<R>::ON_UPPER;
      else
         return SPxSolverBase<R>::ZERO;
   }
   // if the real LP is loaded, ask solver
   else if(_isRealLPLoaded)
   {
      return _solver.getBasisColStatus(col);
   }
   // if the real LP is not loaded, the basis is stored in the basis arrays of this class
   else
   {
      assert(col < _basisStatusCols.size());
      return _basisStatusCols[col];
   }
}